

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::access_chain_internal_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,uint32_t base,uint32_t *indices,
          uint32_t count,AccessChainFlags flags,AccessChainMeta *meta)

{
  uint uVar1;
  Variant *pVVar2;
  size_t sVar3;
  pointer pcVar4;
  ID id;
  char cVar5;
  bool bVar6;
  char cVar7;
  uint32_t uVar8;
  StorageClass SVar9;
  int iVar10;
  SPIRExpression *pSVar11;
  undefined4 extraout_var_00;
  SPIRType *pSVar12;
  long lVar13;
  undefined7 extraout_var;
  string *psVar14;
  SPIRVariable *var;
  SPIRType *pSVar15;
  mapped_type *pmVar16;
  SPIRConstant *pSVar17;
  runtime_error *prVar18;
  uint32_t uVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  string *unaff_RBX;
  undefined7 uVar20;
  uint uVar21;
  CompilerGLSL *pCVar22;
  _Alloc_hider _Var23;
  undefined4 in_register_00000084;
  string *psVar24;
  undefined4 in_register_0000008c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3;
  ulong uVar25;
  bool is_packed;
  string qual_mbr_name;
  BuiltIn builtin;
  uint32_t local_100;
  bool local_f9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  string local_f0;
  byte local_c9;
  AccessChainFlags local_c8;
  uint local_c4;
  uint local_c0;
  ID local_bc;
  string local_b8;
  uint32_t local_94;
  ulong local_90;
  uint local_88;
  uint local_84;
  ulong local_80;
  BuiltIn local_78;
  uint local_74;
  ulong local_70;
  string local_68;
  _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_48;
  ulong local_40;
  uint32_t *local_38;
  
  ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         CONCAT44(in_register_0000008c,flags);
  psVar24 = (string *)CONCAT44(in_register_00000084,count);
  local_f8 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_f8;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_70 = (ulong)base;
  local_c8 = flags;
  local_bc.id = base;
  local_38 = indices;
  if ((flags & 2) == 0) {
    if ((local_70 < (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size
        ) && (pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
             pVVar2[local_70].type == TypeExpression)) {
      pSVar11 = Variant::get<spirv_cross::SPIRExpression>(pVVar2 + local_70);
    }
    else {
      pSVar11 = (SPIRExpression *)0x0;
    }
    if (pSVar11 == (SPIRExpression *)0x0) {
      bVar6 = false;
    }
    else {
      bVar6 = pSVar11->need_transpose;
      pSVar11->need_transpose = false;
    }
    to_enclosed_expression_abi_cxx11_(&local_f0,this,local_bc.id,(local_c8 & 8) == 0);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if (pSVar11 != (SPIRExpression *)0x0) {
      pSVar11->need_transpose = bVar6;
    }
  }
  id.id = local_bc.id;
  uVar8 = Compiler::expression_type_id(&this->super_Compiler,local_bc.id);
  local_90 = CONCAT44(extraout_var_00,uVar8);
  if ((this->backend).native_pointers == false) {
    if ((local_c8 & 4) != 0) {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,
                 "Backend does not support native pointers and does not support OpPtrAccessChain.",
                 "");
      ::std::runtime_error::runtime_error(prVar18,(string *)&local_f0);
      *(undefined ***)prVar18 = &PTR__runtime_error_0035b0b8;
      __cxa_throw(prVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    bVar6 = should_dereference(this,id.id);
    if (bVar6) {
      pSVar12 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr
                           + (local_90 & 0xffffffff));
      dereference_expression(&local_f0,this,pSVar12,__return_storage_ptr__);
      ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_f0);
      unaff_RBX = __return_storage_ptr__;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
    }
  }
  pSVar12 = Compiler::get_pointee_type(&this->super_Compiler,(uint32_t)local_90);
  lVar13 = ::std::__cxx11::string::find((char)__return_storage_ptr__,0x5b);
  local_c9 = lVar13 != -1;
  local_c0 = (*(this->super_Compiler)._vptr_Compiler[0x25])(this,(ulong)id.id);
  local_f9 = Compiler::has_extended_decoration
                       (&this->super_Compiler,id.id,SPIRVCrossDecorationPhysicalTypePacked);
  local_94 = Compiler::get_extended_decoration
                       (&this->super_Compiler,id.id,SPIRVCrossDecorationPhysicalTypeID);
  bVar6 = Compiler::has_decoration(&this->super_Compiler,id,DecorationInvariant);
  local_88 = (uint)CONCAT71(extraout_var,bVar6);
  uVar25 = 0;
  if (count != 0) {
    local_74 = local_c8 & 0x11;
    local_48 = (_Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                *)&(this->super_Compiler).ir.meta;
    local_84 = local_c8 & 0xfffffffe;
    local_80 = 0;
    local_c4 = 0;
    local_40 = (ulong)count;
    do {
      uVar1 = local_38[uVar25];
      uVar21 = 0;
      if (-1 < (int)uVar1) {
        uVar21 = local_c8 & 0xff;
      }
      uVar8 = uVar1 & 0x7fffffff;
      if (local_74 != 0x11) {
        uVar8 = uVar1;
        uVar21 = local_c8 & 0xff;
      }
      uVar20 = (undefined7)((ulong)unaff_RBX >> 8);
      local_100 = uVar8;
      if (uVar25 == 0 && (local_c8 & 4) != 0) {
        if ((this->options).flatten_multidimensional_arrays == true) {
          bVar6 = (pSVar12->array).super_VectorView<unsigned_int>.buffer_size == 0;
          unaff_RBX = (string *)CONCAT71(uVar20,!bVar6);
          local_c4 = (uint)unaff_RBX;
          if (bVar6) {
            local_80 = (ulong)unaff_RBX & 0xffffffff;
          }
          else {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            local_80 = (ulong)unaff_RBX & 0xffffffff;
            uVar8 = extraout_EDX;
          }
        }
        uVar19 = local_100;
        if (((this->options).flatten_multidimensional_arrays == true) && ((local_80 & 1) != 0)) {
          if ((uVar21 & 1) == 0) {
            to_enclosed_expression_abi_cxx11_(&local_f0,this,local_100,(local_c8 & 8) == 0);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
          }
          else {
            cVar7 = '\x01';
            if (9 < local_100) {
              uVar8 = local_100;
              cVar5 = '\x04';
              do {
                cVar7 = cVar5;
                if (uVar8 < 100) {
                  cVar7 = cVar7 + -2;
                  goto LAB_001c13ff;
                }
                if (uVar8 < 1000) {
                  cVar7 = cVar7 + -1;
                  goto LAB_001c13ff;
                }
                if (uVar8 < 10000) goto LAB_001c13ff;
                bVar6 = 99999 < uVar8;
                uVar8 = uVar8 / 10000;
                cVar5 = cVar7 + '\x04';
              } while (bVar6);
              cVar7 = cVar7 + '\x01';
            }
LAB_001c13ff:
            local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
            ::std::__cxx11::string::_M_construct((ulong)&local_f0,cVar7);
            ::std::__detail::__to_chars_10_impl<unsigned_int>
                      (local_f0._M_dataplus._M_p,(undefined4)local_f0._M_string_length,uVar19);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          uVar8 = (uint32_t)(pSVar12->array).super_VectorView<unsigned_int>.buffer_size;
          while (uVar8 != 0) {
            uVar8 = uVar8 - 1;
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            pCVar22 = this;
            to_array_size_abi_cxx11_(&local_b8,this,pSVar12,uVar8);
            enclose_expression(&local_f0,pCVar22,&local_b8);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p);
            }
          }
          if ((pSVar12->array).super_VectorView<unsigned_int>.buffer_size == 0) {
            local_c4 = 0;
          }
          else {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
          if ((local_c4 & 1) == 0) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        }
        else {
          uVar1 = local_84;
          if ((uVar21 & 1) != 0) {
            uVar1 = local_c8;
          }
          psVar24 = (string *)(ulong)uVar1;
          access_chain_internal_append_index
                    (this,__return_storage_ptr__,uVar8,pSVar12,uVar1,(bool *)ts_3,local_100);
        }
        local_c9 = 1;
        if (*(int *)&(pSVar12->super_IVariant).field_0xc == 0x15) {
          local_90 = (ulong)(pSVar12->parent_type).id;
          pSVar12 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                               ptr + local_90);
        }
      }
      else {
        sVar3 = (pSVar12->array).super_VectorView<unsigned_int>.buffer_size;
        if (sVar3 == 0) {
          if (*(int *)&(pSVar12->super_IVariant).field_0xc == 0xf) {
            if ((uVar21 & 1) == 0) {
              local_100 = Compiler::evaluate_constant_u32(&this->super_Compiler,uVar8);
            }
            if ((pSVar12->member_types).
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.buffer_size <=
                (ulong)local_100) {
              prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_f0,"Member index is out of bounds!","");
              ::std::runtime_error::runtime_error(prVar18,(string *)&local_f0);
              *(undefined ***)prVar18 = &PTR__runtime_error_0035b0b8;
              __cxa_throw(prVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
            }
            bVar6 = Compiler::is_member_builtin(&this->super_Compiler,pSVar12,local_100,&local_78);
            if (bVar6) {
              if ((local_c9 & 1) == 0) {
                (*(this->super_Compiler)._vptr_Compiler[0x14])
                          (&local_f0,this,(ulong)local_78,(ulong)pSVar12->storage);
                ::std::__cxx11::string::operator=
                          ((string *)__return_storage_ptr__,(string *)&local_f0);
              }
              else {
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                (*(this->super_Compiler)._vptr_Compiler[0x14])
                          (&local_f0,this,(ulong)local_78,(ulong)pSVar12->storage);
                ::std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
              }
            }
            else {
              psVar14 = Compiler::get_member_qualified_name_abi_cxx11_
                                  (&this->super_Compiler,(TypeID)(uint32_t)local_90,local_100);
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              pcVar4 = (psVar14->_M_dataplus)._M_p;
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_f0,pcVar4,pcVar4 + psVar14->_M_string_length);
              if (local_f0._M_string_length == 0) {
                ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (ulong)local_c8;
                if ((local_c8 & 0x20) == 0) {
                  ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ulong)((local_c8 & 4) >> 2);
                  psVar24 = (string *)(ulong)local_100;
                  (*(this->super_Compiler)._vptr_Compiler[0x2a])
                            (&local_b8,this,(ulong)local_bc.id,pSVar12);
                  ::std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
                  psVar14 = &local_b8;
                  _Var23._M_p = local_b8._M_dataplus._M_p;
                }
                else {
                  ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (ulong)local_100;
                  unaff_RBX = &local_68;
                  to_member_name_abi_cxx11_(unaff_RBX,this,pSVar12,local_100);
                  join<char_const(&)[2],std::__cxx11::string>
                            (&local_b8,(spirv_cross *)0x2e7de5,(char (*) [2])unaff_RBX,ts_1);
                  ::std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                    operator_delete(local_b8._M_dataplus._M_p);
                  }
                  psVar14 = &local_68;
                  _Var23._M_p = local_68._M_dataplus._M_p;
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var23._M_p != &psVar14->field_2) {
                  operator_delete(_Var23._M_p);
                }
              }
              else {
                ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
            bVar6 = Compiler::has_member_decoration
                              (&this->super_Compiler,(TypeID)(pSVar12->super_IVariant).self.id,
                               local_100,DecorationInvariant);
            local_88 = local_88 & 0xff;
            if (bVar6) {
              local_88 = 1;
            }
            local_f9 = Compiler::has_extended_member_decoration
                                 (&this->super_Compiler,(pSVar12->super_IVariant).self.id,local_100,
                                  SPIRVCrossDecorationPhysicalTypePacked);
            bVar6 = Compiler::has_extended_member_decoration
                              (&this->super_Compiler,(pSVar12->super_IVariant).self.id,local_100,
                               SPIRVCrossDecorationPhysicalTypeID);
            local_94 = 0;
            if (bVar6) {
              local_94 = Compiler::get_extended_member_decoration
                                   (&this->super_Compiler,(pSVar12->super_IVariant).self.id,
                                    local_100,SPIRVCrossDecorationPhysicalTypeID);
            }
            local_c0 = (*(this->super_Compiler)._vptr_Compiler[0x26])(this,pSVar12,(ulong)local_100)
            ;
            pSVar12 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_Compiler).ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr +
                                 (pSVar12->member_types).
                                 super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.ptr
                                 [local_100].id);
          }
          else if (pSVar12->columns < 2) {
            if (pSVar12->vecsize < 2) {
              if ((this->backend).allow_truncated_access_chain == false) {
                prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_f0,"Cannot subdivide a scalar value!","");
                ::std::runtime_error::runtime_error(prVar18,(string *)&local_f0);
                *(undefined ***)prVar18 = &PTR__runtime_error_0035b0b8;
                __cxa_throw(prVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
              }
            }
            else {
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              local_f0._M_string_length = 0;
              local_f0.field_2._M_local_buf[0] = '\0';
              if (((local_c0 & 1) != 0) &&
                 (lVar13 = ::std::__cxx11::string::rfind((char)__return_storage_ptr__,0x5b),
                 lVar13 != -1)) {
                unaff_RBX = &local_b8;
                ::std::__cxx11::string::substr((ulong)unaff_RBX,(ulong)__return_storage_ptr__);
                ::std::__cxx11::string::operator=((string *)&local_f0,(string *)unaff_RBX);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  operator_delete(local_b8._M_dataplus._M_p);
                }
                ::std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)lVar13);
              }
              pSVar15 = Compiler::expression_type(&this->super_Compiler,local_bc.id);
              SVar9 = StorageClassGeneric;
              if (pSVar15->pointer == true) {
                SVar9 = Compiler::get_expression_effective_storage_class
                                  (&this->super_Compiler,local_bc.id);
              }
              if ((local_c0 & 1) == 0) {
                pSVar15 = Variant::get<spirv_cross::SPIRType>
                                    ((this->super_Compiler).ir.ids.
                                     super_VectorView<spirv_cross::Variant>.ptr +
                                     (pSVar12->parent_type).id);
                ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (this->super_Compiler)._vptr_Compiler;
                psVar24 = (string *)&local_f9;
                (*(code *)ts_3[10]._M_string_length)(this,__return_storage_ptr__,pSVar15,SVar9);
              }
              if (((uVar21 & 1) == 0) || (((local_f9 | (byte)local_c0) & 1) != 0)) {
                pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr;
                if ((pVVar2[local_100].type != TypeConstant) ||
                   (((local_f9 | (byte)local_c0) & 1) != 0)) {
                  if ((uVar21 & 1) != 0) {
                    join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                              (&local_b8,(spirv_cross *)0x2f570e,(char (*) [2])&local_100,
                               (uint *)0x2e790f,(char (*) [2])psVar24);
                    ::std::__cxx11::string::_M_append
                              ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
                    psVar14 = &local_b8;
                    _Var23._M_p = local_b8._M_dataplus._M_p;
                    goto LAB_001c15d5;
                  }
                  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                  to_expression_abi_cxx11_(&local_b8,this,local_100,(local_c8 & 8) == 0);
                  ::std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                    operator_delete(local_b8._M_dataplus._M_p);
                  }
                  goto LAB_001c0e68;
                }
                pSVar17 = Variant::get<spirv_cross::SPIRConstant>(pVVar2 + local_100);
                if (pSVar17->specialization == true) {
                  unaff_RBX = &local_68;
                  to_expression_abi_cxx11_(unaff_RBX,this,local_100,true);
                  join<char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                            (&local_b8,(spirv_cross *)0x2f570e,(char (*) [2])unaff_RBX,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             0x2e790f,(char (*) [2])psVar24);
                  ::std::__cxx11::string::_M_append
                            ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                    operator_delete(local_b8._M_dataplus._M_p);
                  }
                  psVar14 = &local_68;
                  _Var23._M_p = local_68._M_dataplus._M_p;
LAB_001c15d5:
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var23._M_p != &psVar14->field_2) {
                    operator_delete(_Var23._M_p);
                  }
                }
                else {
                  pCVar22 = (CompilerGLSL *)__return_storage_ptr__;
                  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                  index_to_swizzle(pCVar22,(pSVar17->m).c[0].r[0].u32);
                  ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                }
              }
              else {
                pCVar22 = (CompilerGLSL *)__return_storage_ptr__;
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                index_to_swizzle(pCVar22,local_100);
LAB_001c0e68:
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
              if ((local_c0 & 1) != 0) {
                pSVar15 = Variant::get<spirv_cross::SPIRType>
                                    ((this->super_Compiler).ir.ids.
                                     super_VectorView<spirv_cross::Variant>.ptr +
                                     (pSVar12->parent_type).id);
                ts_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (this->super_Compiler)._vptr_Compiler;
                psVar24 = (string *)&local_f9;
                (*(code *)ts_3[10]._M_string_length)(this,__return_storage_ptr__,pSVar15,SVar9);
              }
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
              local_f9 = false;
              local_90 = (ulong)(pSVar12->parent_type).id;
              pSVar12 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_Compiler).ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr + local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p);
              }
              local_94 = 0;
              local_c0 = 0;
            }
          }
          else {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            uVar8 = local_100;
            if ((uVar21 & 1) == 0) {
              to_expression_abi_cxx11_(&local_f0,this,local_100,(local_c8 & 8) == 0);
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
            }
            else {
              cVar7 = '\x01';
              if (9 < local_100) {
                uVar19 = local_100;
                cVar5 = '\x04';
                do {
                  cVar7 = cVar5;
                  if (uVar19 < 100) {
                    cVar7 = cVar7 + -2;
                    goto LAB_001c172c;
                  }
                  if (uVar19 < 1000) {
                    cVar7 = cVar7 + -1;
                    goto LAB_001c172c;
                  }
                  if (uVar19 < 10000) goto LAB_001c172c;
                  bVar6 = 99999 < uVar19;
                  uVar19 = uVar19 / 10000;
                  cVar5 = cVar7 + '\x04';
                } while (bVar6);
                cVar7 = cVar7 + '\x01';
              }
LAB_001c172c:
              local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
              ::std::__cxx11::string::_M_construct((ulong)&local_f0,cVar7);
              ::std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_f0._M_dataplus._M_p,(undefined4)local_f0._M_string_length,uVar8);
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
            local_90 = (ulong)(pSVar12->parent_type).id;
            pSVar12 = Variant::get<spirv_cross::SPIRType>
                                ((this->super_Compiler).ir.ids.
                                 super_VectorView<spirv_cross::Variant>.ptr + local_90);
          }
        }
        else {
          if (((this->options).flatten_multidimensional_arrays == true) && ((local_c4 & 1) == 0)) {
            unaff_RBX = (string *)CONCAT71(uVar20,sVar3 != 1);
            local_c4 = (uint)unaff_RBX;
            if (sVar3 == 1) {
              local_80 = (ulong)unaff_RBX & 0xffffffff;
            }
            else {
              ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              local_80 = (ulong)unaff_RBX & 0xffffffff;
            }
          }
          if ((pSVar12->parent_type).id == 0) {
            __assert_fail("type->parent_type",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/3D4Medical[P]SPIRV-Cross/spirv_glsl.cpp"
                          ,0x1fcd,
                          "string spirv_cross::CompilerGLSL::access_chain_internal(uint32_t, const uint32_t *, uint32_t, AccessChainFlags, AccessChainMeta *)"
                         );
          }
          if ((local_70 <
               (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.buffer_size) &&
             (pVVar2 = (this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr,
             pVVar2[local_70].type == TypeVariable)) {
            var = Variant::get<spirv_cross::SPIRVariable>(pVVar2 + local_70);
          }
          else {
            var = (SPIRVariable *)0x0;
          }
          if ((((uVar25 != 0) || (var == (SPIRVariable *)0x0)) ||
              ((this->backend).force_gl_in_out_block == false)) ||
             ((bVar6 = Compiler::is_builtin_variable(&this->super_Compiler,var), !bVar6 ||
              (bVar6 = Compiler::has_decoration
                                 (&this->super_Compiler,(ID)(pSVar12->super_IVariant).self.id,
                                  DecorationBlock), bVar6)))) {
            if (((this->options).flatten_multidimensional_arrays == true) && ((local_80 & 1) != 0))
            {
              pSVar15 = Variant::get<spirv_cross::SPIRType>
                                  ((this->super_Compiler).ir.ids.
                                   super_VectorView<spirv_cross::Variant>.ptr +
                                   (pSVar12->parent_type).id);
              uVar8 = local_100;
              if ((uVar21 & 1) == 0) {
                to_enclosed_expression_abi_cxx11_(&local_f0,this,local_100,(local_c8 & 8) == 0);
                ::std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
              }
              else {
                cVar7 = '\x01';
                if (9 < local_100) {
                  uVar19 = local_100;
                  cVar5 = '\x04';
                  do {
                    cVar7 = cVar5;
                    if (uVar19 < 100) {
                      cVar7 = cVar7 + -2;
                      goto LAB_001c15ef;
                    }
                    if (uVar19 < 1000) {
                      cVar7 = cVar7 + -1;
                      goto LAB_001c15ef;
                    }
                    if (uVar19 < 10000) goto LAB_001c15ef;
                    bVar6 = 99999 < uVar19;
                    uVar19 = uVar19 / 10000;
                    cVar5 = cVar7 + '\x04';
                  } while (bVar6);
                  cVar7 = cVar7 + '\x01';
                }
LAB_001c15ef:
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                ::std::__cxx11::string::_M_construct((ulong)&local_f0,cVar7);
                ::std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_f0._M_dataplus._M_p,(undefined4)local_f0._M_string_length,uVar8);
                ::std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p);
              }
              uVar8 = (uint32_t)(pSVar15->array).super_VectorView<unsigned_int>.buffer_size;
              while (uVar8 != 0) {
                uVar8 = uVar8 - 1;
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
                unaff_RBX = &local_b8;
                pCVar22 = this;
                to_array_size_abi_cxx11_(unaff_RBX,this,pSVar15,uVar8);
                enclose_expression(&local_f0,pCVar22,unaff_RBX);
                ::std::__cxx11::string::_M_append
                          ((char *)__return_storage_ptr__,(ulong)local_f0._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                  operator_delete(local_b8._M_dataplus._M_p);
                }
              }
              if ((pSVar15->array).super_VectorView<unsigned_int>.buffer_size == 0) {
                local_c4 = 0;
              }
              else {
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
              if ((local_c4 & 1) == 0) {
                ::std::__cxx11::string::append((char *)__return_storage_ptr__);
              }
            }
            else {
              uVar8 = Compiler::get_decoration(&this->super_Compiler,local_bc,DecorationBuiltIn);
              iVar10 = (*(this->super_Compiler)._vptr_Compiler[0x22])(this,(ulong)uVar8);
              if ((char)iVar10 == '\0') {
                uVar1 = local_84;
                if ((uVar21 & 1) != 0) {
                  uVar1 = local_c8;
                }
                psVar24 = (string *)(ulong)uVar1;
                access_chain_internal_append_index
                          (this,__return_storage_ptr__,extraout_EDX_00,pSVar12,uVar1,(bool *)ts_3,
                           local_100);
              }
            }
          }
          else {
            local_f0._M_dataplus._M_p._0_4_ = local_bc.id;
            pmVar16 = ::std::__detail::
                      _Map_base<spirv_cross::TypedID<(spirv_cross::Types)0>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[](local_48,(key_type *)&local_f0);
            if ((pmVar16->decoration).builtin_type < 2) {
              psVar24 = __return_storage_ptr__;
              if (var->storage == StorageClassOutput) {
                to_expression_abi_cxx11_(&local_b8,this,local_100,(local_c8 & 8) == 0);
                join<char_const(&)[8],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                          (&local_f0,(spirv_cross *)"gl_out[",(char (*) [8])&local_b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x2e42be,(char (*) [3])__return_storage_ptr__,ts_3);
              }
              else {
                if (var->storage != StorageClassInput) goto LAB_001c10fe;
                to_expression_abi_cxx11_(&local_b8,this,local_100,(local_c8 & 8) == 0);
                join<char_const(&)[7],std::__cxx11::string,char_const(&)[3],std::__cxx11::string&>
                          (&local_f0,(spirv_cross *)"gl_in[",(char (*) [7])&local_b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           0x2e42be,(char (*) [3])__return_storage_ptr__,ts_3);
              }
              ::std::__cxx11::string::operator=
                        ((string *)__return_storage_ptr__,(string *)&local_f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                operator_delete(local_f0._M_dataplus._M_p);
              }
              unaff_RBX = __return_storage_ptr__;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p);
              }
            }
            else {
LAB_001c10fe:
              uVar1 = local_84;
              if ((uVar21 & 1) != 0) {
                uVar1 = local_c8;
              }
              psVar24 = (string *)(ulong)uVar1;
              access_chain_internal_append_index
                        (this,__return_storage_ptr__,extraout_EDX_01,pSVar12,uVar1,(bool *)ts_3,
                         local_100);
            }
          }
          local_90 = (ulong)(pSVar12->parent_type).id;
          pSVar12 = Variant::get<spirv_cross::SPIRType>
                              ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.
                               ptr + local_90);
          local_c9 = 1;
        }
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != local_40);
    uVar25 = (ulong)local_c4;
  }
  if ((uVar25 & 1) != 0) {
    prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,
               "Flattening of multidimensional arrays were enabled, but the access chain was terminated in the middle of a multidimensional array. This is not supported."
               ,"");
    ::std::runtime_error::runtime_error(prVar18,(string *)&local_f0);
    *(undefined ***)prVar18 = &PTR__runtime_error_0035b0b8;
    __cxa_throw(prVar18,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (meta != (AccessChainMeta *)0x0) {
    meta->need_transpose = (bool)((byte)local_c0 & 1);
    meta->storage_is_packed = local_f9;
    meta->storage_is_invariant = (bool)((byte)local_88 & 1);
    meta->storage_physical_type = local_94;
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::access_chain_internal(uint32_t base, const uint32_t *indices, uint32_t count,
                                           AccessChainFlags flags, AccessChainMeta *meta)
{
	string expr;

	bool index_is_literal = (flags & ACCESS_CHAIN_INDEX_IS_LITERAL_BIT) != 0;
	bool msb_is_id = (flags & ACCESS_CHAIN_LITERAL_MSB_FORCE_ID) != 0;
	bool chain_only = (flags & ACCESS_CHAIN_CHAIN_ONLY_BIT) != 0;
	bool ptr_chain = (flags & ACCESS_CHAIN_PTR_CHAIN_BIT) != 0;
	bool register_expression_read = (flags & ACCESS_CHAIN_SKIP_REGISTER_EXPRESSION_READ_BIT) == 0;
	bool flatten_member_reference = (flags & ACCESS_CHAIN_FLATTEN_ALL_MEMBERS_BIT) != 0;

	if (!chain_only)
	{
		// We handle transpose explicitly, so don't resolve that here.
		auto *e = maybe_get<SPIRExpression>(base);
		bool old_transpose = e && e->need_transpose;
		if (e)
			e->need_transpose = false;
		expr = to_enclosed_expression(base, register_expression_read);
		if (e)
			e->need_transpose = old_transpose;
	}

	// Start traversing type hierarchy at the proper non-pointer types,
	// but keep type_id referencing the original pointer for use below.
	uint32_t type_id = expression_type_id(base);

	if (!backend.native_pointers)
	{
		if (ptr_chain)
			SPIRV_CROSS_THROW("Backend does not support native pointers and does not support OpPtrAccessChain.");

		// Wrapped buffer reference pointer types will need to poke into the internal "value" member before
		// continuing the access chain.
		if (should_dereference(base))
		{
			auto &type = get<SPIRType>(type_id);
			expr = dereference_expression(type, expr);
		}
	}

	const auto *type = &get_pointee_type(type_id);

	bool access_chain_is_arrayed = expr.find_first_of('[') != string::npos;
	bool row_major_matrix_needs_conversion = is_non_native_row_major_matrix(base);
	bool is_packed = has_extended_decoration(base, SPIRVCrossDecorationPhysicalTypePacked);
	uint32_t physical_type = get_extended_decoration(base, SPIRVCrossDecorationPhysicalTypeID);
	bool is_invariant = has_decoration(base, DecorationInvariant);
	bool pending_array_enclose = false;
	bool dimension_flatten = false;

	const auto append_index = [&](uint32_t index, bool is_literal) {
		AccessChainFlags mod_flags = flags;
		if (!is_literal)
			mod_flags &= ~ACCESS_CHAIN_INDEX_IS_LITERAL_BIT;
		access_chain_internal_append_index(expr, base, type, mod_flags, access_chain_is_arrayed, index);
	};

	for (uint32_t i = 0; i < count; i++)
	{
		uint32_t index = indices[i];

		bool is_literal = index_is_literal;
		if (is_literal && msb_is_id && (index >> 31u) != 0u)
		{
			is_literal = false;
			index &= 0x7fffffffu;
		}

		// Pointer chains
		if (ptr_chain && i == 0)
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays)
			{
				dimension_flatten = type->array.size() >= 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(type->array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(*type, j - 1));
				}

				if (type->array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			else
			{
				append_index(index, is_literal);
			}

			if (type->basetype == SPIRType::ControlPointArray)
			{
				type_id = type->parent_type;
				type = &get<SPIRType>(type_id);
			}

			access_chain_is_arrayed = true;
		}
		// Arrays
		else if (!type->array.empty())
		{
			// If we are flattening multidimensional arrays, only create opening bracket on first
			// array index.
			if (options.flatten_multidimensional_arrays && !pending_array_enclose)
			{
				dimension_flatten = type->array.size() > 1;
				pending_array_enclose = dimension_flatten;
				if (pending_array_enclose)
					expr += "[";
			}

			assert(type->parent_type);

			auto *var = maybe_get<SPIRVariable>(base);
			if (backend.force_gl_in_out_block && i == 0 && var && is_builtin_variable(*var) &&
			    !has_decoration(type->self, DecorationBlock))
			{
				// This deals with scenarios for tesc/geom where arrays of gl_Position[] are declared.
				// Normally, these variables live in blocks when compiled from GLSL,
				// but HLSL seems to just emit straight arrays here.
				// We must pretend this access goes through gl_in/gl_out arrays
				// to be able to access certain builtins as arrays.
				auto builtin = ir.meta[base].decoration.builtin_type;
				switch (builtin)
				{
				// case BuiltInCullDistance: // These are already arrays, need to figure out rules for these in tess/geom.
				// case BuiltInClipDistance:
				case BuiltInPosition:
				case BuiltInPointSize:
					if (var->storage == StorageClassInput)
						expr = join("gl_in[", to_expression(index, register_expression_read), "].", expr);
					else if (var->storage == StorageClassOutput)
						expr = join("gl_out[", to_expression(index, register_expression_read), "].", expr);
					else
						append_index(index, is_literal);
					break;

				default:
					append_index(index, is_literal);
					break;
				}
			}
			else if (options.flatten_multidimensional_arrays && dimension_flatten)
			{
				// If we are flattening multidimensional arrays, do manual stride computation.
				auto &parent_type = get<SPIRType>(type->parent_type);

				if (is_literal)
					expr += convert_to_string(index);
				else
					expr += to_enclosed_expression(index, register_expression_read);

				for (auto j = uint32_t(parent_type.array.size()); j; j--)
				{
					expr += " * ";
					expr += enclose_expression(to_array_size(parent_type, j - 1));
				}

				if (parent_type.array.empty())
					pending_array_enclose = false;
				else
					expr += " + ";

				if (!pending_array_enclose)
					expr += "]";
			}
			// Some builtins are arrays in SPIR-V but not in other languages, e.g. gl_SampleMask[] is an array in SPIR-V but not in Metal.
			// By throwing away the index, we imply the index was 0, which it must be for gl_SampleMask.
			else if (!builtin_translates_to_nonarray(BuiltIn(get_decoration(base, DecorationBuiltIn))))
			{
				append_index(index, is_literal);
			}

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);

			access_chain_is_arrayed = true;
		}
		// For structs, the index refers to a constant, which indexes into the members.
		// We also check if this member is a builtin, since we then replace the entire expression with the builtin one.
		else if (type->basetype == SPIRType::Struct)
		{
			if (!is_literal)
				index = evaluate_constant_u32(index);

			if (index >= type->member_types.size())
				SPIRV_CROSS_THROW("Member index is out of bounds!");

			BuiltIn builtin;
			if (is_member_builtin(*type, index, &builtin))
			{
				if (access_chain_is_arrayed)
				{
					expr += ".";
					expr += builtin_to_glsl(builtin, type->storage);
				}
				else
					expr = builtin_to_glsl(builtin, type->storage);
			}
			else
			{
				// If the member has a qualified name, use it as the entire chain
				string qual_mbr_name = get_member_qualified_name(type_id, index);
				if (!qual_mbr_name.empty())
					expr = qual_mbr_name;
				else if (flatten_member_reference)
					expr += join("_", to_member_name(*type, index));
				else
					expr += to_member_reference(base, *type, index, ptr_chain);
			}

			if (has_member_decoration(type->self, index, DecorationInvariant))
				is_invariant = true;

			is_packed = member_is_packed_physical_type(*type, index);
			if (member_is_remapped_physical_type(*type, index))
				physical_type = get_extended_member_decoration(type->self, index, SPIRVCrossDecorationPhysicalTypeID);
			else
				physical_type = 0;

			row_major_matrix_needs_conversion = member_is_non_native_row_major_matrix(*type, index);
			type = &get<SPIRType>(type->member_types[index]);
		}
		// Matrix -> Vector
		else if (type->columns > 1)
		{
			// If we have a row-major matrix here, we need to defer any transpose in case this access chain
			// is used to store a column. We can resolve it right here and now if we access a scalar directly,
			// by flipping indexing order of the matrix.

			expr += "[";
			if (is_literal)
				expr += convert_to_string(index);
			else
				expr += to_expression(index, register_expression_read);
			expr += "]";

			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		// Vector -> Scalar
		else if (type->vecsize > 1)
		{
			string deferred_index;
			if (row_major_matrix_needs_conversion)
			{
				// Flip indexing order.
				auto column_index = expr.find_last_of('[');
				if (column_index != string::npos)
				{
					deferred_index = expr.substr(column_index);
					expr.resize(column_index);
				}
			}

			// Internally, access chain implementation can also be used on composites,
			// ignore scalar access workarounds in this case.
			StorageClass effective_storage;
			if (expression_type(base).pointer)
				effective_storage = get_expression_effective_storage_class(base);
			else
				effective_storage = StorageClassGeneric;

			if (!row_major_matrix_needs_conversion)
			{
				// On some backends, we might not be able to safely access individual scalars in a vector.
				// To work around this, we might have to cast the access chain reference to something which can,
				// like a pointer to scalar, which we can then index into.
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			if (is_literal && !is_packed && !row_major_matrix_needs_conversion)
			{
				expr += ".";
				expr += index_to_swizzle(index);
			}
			else if (ir.ids[index].get_type() == TypeConstant && !is_packed && !row_major_matrix_needs_conversion)
			{
				auto &c = get<SPIRConstant>(index);
				if (c.specialization)
				{
					// If the index is a spec constant, we cannot turn extract into a swizzle.
					expr += join("[", to_expression(index), "]");
				}
				else
				{
					expr += ".";
					expr += index_to_swizzle(c.scalar());
				}
			}
			else if (is_literal)
			{
				// For packed vectors, we can only access them as an array, not by swizzle.
				expr += join("[", index, "]");
			}
			else
			{
				expr += "[";
				expr += to_expression(index, register_expression_read);
				expr += "]";
			}

			if (row_major_matrix_needs_conversion)
			{
				prepare_access_chain_for_scalar_access(expr, get<SPIRType>(type->parent_type), effective_storage,
				                                       is_packed);
			}

			expr += deferred_index;
			row_major_matrix_needs_conversion = false;

			is_packed = false;
			physical_type = 0;
			type_id = type->parent_type;
			type = &get<SPIRType>(type_id);
		}
		else if (!backend.allow_truncated_access_chain)
			SPIRV_CROSS_THROW("Cannot subdivide a scalar value!");
	}

	if (pending_array_enclose)
	{
		SPIRV_CROSS_THROW("Flattening of multidimensional arrays were enabled, "
		                  "but the access chain was terminated in the middle of a multidimensional array. "
		                  "This is not supported.");
	}

	if (meta)
	{
		meta->need_transpose = row_major_matrix_needs_conversion;
		meta->storage_is_packed = is_packed;
		meta->storage_is_invariant = is_invariant;
		meta->storage_physical_type = physical_type;
	}

	return expr;
}